

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O3

Quaternion * AML::dcm2Quat(Quaternion *__return_storage_ptr__,Matrix33 *dcm)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar19;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  
  bVar7 = isValidDCM(dcm,0.0001);
  if (bVar7) {
    dVar21 = (dcm->field_0).data[0][0];
    dVar8 = dVar21 + 1.0;
    dVar23 = (dcm->field_0).data[1][1];
    dVar1 = (dcm->field_0).data[2][2];
    dVar10 = dVar8 + dVar23 + dVar1;
    dVar9 = (dVar8 - dVar23) - dVar1;
    dVar21 = 1.0 - dVar21;
    dVar12 = (dVar21 + dVar23) - dVar1;
    dVar1 = (dVar21 - dVar23) + dVar1;
    dVar21 = (dcm->field_0).data[1][2];
    dVar23 = (dcm->field_0).data[2][1];
    dVar14 = (dcm->field_0).data[0][2];
    dVar6 = (dcm->field_0).data[1][0];
    dVar22 = dVar21 - dVar23;
    dVar8 = (dcm->field_0).data[0][1];
    dVar11 = (dcm->field_0).data[2][0];
    dVar13 = dVar11 - dVar14;
    dVar19 = dVar8 + dVar6;
    dVar14 = dVar14 + dVar11;
    dVar8 = dVar8 - dVar6;
    if (((dVar10 < dVar9) || (dVar10 < dVar12)) || (dVar10 < dVar1)) {
      if (((dVar9 < dVar10) || (dVar9 < dVar12)) || (dVar9 < dVar1)) {
        dVar21 = dVar21 + dVar23;
        if (((dVar12 < dVar10) || (dVar12 < dVar9)) || (dVar12 < dVar1)) {
          dVar11 = 0.0;
          dVar23 = 0.0;
          if ((dVar1 < dVar10) || (dVar1 < dVar9)) {
            auVar16 = ZEXT816(0);
          }
          else {
            auVar16 = ZEXT816(0);
            if (dVar12 <= dVar1) {
              if (dVar1 < 0.0) {
                dVar1 = sqrt(dVar1);
              }
              else {
                dVar1 = SQRT(dVar1);
              }
              auVar20._0_8_ = dVar8 * 0.5;
              auVar20._8_8_ = dVar14 * 0.5;
              auVar5._8_8_ = dVar1;
              auVar5._0_8_ = dVar1;
              auVar16 = divpd(auVar20,auVar5);
              dVar11 = auVar16._0_8_;
              dVar23 = auVar16._8_8_;
              auVar16._8_8_ = dVar1 * 0.5;
              auVar16._0_8_ = (dVar21 * 0.5) / dVar1;
            }
          }
        }
        else {
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          auVar18._0_8_ = dVar13 * 0.5;
          auVar18._8_8_ = dVar19 * 0.5;
          auVar4._8_8_ = dVar12;
          auVar4._0_8_ = dVar12;
          auVar16 = divpd(auVar18,auVar4);
          dVar11 = auVar16._0_8_;
          dVar23 = auVar16._8_8_;
          auVar16._8_8_ = (dVar21 * 0.5) / dVar12;
          auVar16._0_8_ = dVar12 * 0.5;
        }
      }
      else {
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar11 = (dVar22 * 0.5) / dVar9;
        dVar23 = dVar9 * 0.5;
        auVar17._0_8_ = dVar19 * 0.5;
        auVar17._8_8_ = dVar14 * 0.5;
        auVar3._8_4_ = SUB84(dVar9,0);
        auVar3._0_8_ = dVar9;
        auVar3._12_4_ = (int)((ulong)dVar9 >> 0x20);
        auVar16 = divpd(auVar17,auVar3);
      }
    }
    else {
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar11 = dVar10 * 0.5;
      dVar23 = (dVar22 * 0.5) / dVar10;
      auVar15._0_8_ = dVar13 * 0.5;
      auVar15._8_8_ = dVar8 * 0.5;
      auVar2._8_4_ = SUB84(dVar10,0);
      auVar2._0_8_ = dVar10;
      auVar2._12_4_ = (int)((ulong)dVar10 >> 0x20);
      auVar16 = divpd(auVar15,auVar2);
    }
    (__return_storage_ptr__->field_0).data[0] = dVar11;
    (__return_storage_ptr__->field_0).data[1] = dVar23;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->field_0 + 0x10) = auVar16;
  }
  else {
    (__return_storage_ptr__->field_0).data[0] = 1.0;
    (__return_storage_ptr__->field_0).data[1] = 0.0;
    (__return_storage_ptr__->field_0).data[2] = 0.0;
    (__return_storage_ptr__->field_0).data[3] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Quaternion dcm2Quat(const Matrix33& dcm)
    {
        const double TOL = 0.0001;

        // Check if DCM is Valid
        if (isValidDCM(dcm, TOL))
        {
            double q0 = 0.0;
            double q1 = 0.0;
            double q2 = 0.0;
            double q3 = 0.0;
            const double x4q0_2 = (1.0 + dcm.m11 + dcm.m22 + dcm.m33);
            const double x4q1_2 = (1.0 + dcm.m11 - dcm.m22 - dcm.m33);
            const double x4q2_2 = (1.0 - dcm.m11 + dcm.m22 - dcm.m33);
            const double x4q3_2 = (1.0 - dcm.m11 - dcm.m22 + dcm.m33);
            const double x4q2q3 = dcm.m23 + dcm.m32;
            const double x4q1q3 = dcm.m31 + dcm.m13;
            const double x4q1q2 = dcm.m12 + dcm.m21;
            const double x4q0q1 = dcm.m23 - dcm.m32;
            const double x4q0q2 = dcm.m31 - dcm.m13;
            const double x4q0q3 = dcm.m12 - dcm.m21;

            // Check which Trace is Largest
            if (x4q0_2 >= x4q1_2 && x4q0_2 >= x4q2_2 && x4q0_2 >= x4q3_2) // 4q0_2 Largest
            {
                const double x2q0 = sqrt(x4q0_2);
                q0 = 0.5 * x2q0;
                q1 = 0.5 * x4q0q1 / x2q0;
                q2 = 0.5 * x4q0q2 / x2q0;
                q3 = 0.5 * x4q0q3 / x2q0;
            }
            else if (x4q1_2 >= x4q0_2 && x4q1_2 >= x4q2_2 && x4q1_2 >= x4q3_2) // 4q1_2 Largest
            {
                const double x2q1 = sqrt(x4q1_2);
                q0 = 0.5 * x4q0q1 / x2q1;
                q1 = 0.5 * x2q1;
                q2 = 0.5 * x4q1q2 / x2q1;
                q3 = 0.5 * x4q1q3 / x2q1;
            }
            else if (x4q2_2 >= x4q0_2 && x4q2_2 >= x4q1_2 && x4q2_2 >= x4q3_2) // 4q2_2 Largest
            {
                const double x2q2 = sqrt(x4q2_2);
                q0 = 0.5 * x4q0q2 / x2q2;
                q1 = 0.5 * x4q1q2 / x2q2;
                q2 = 0.5 * x2q2;
                q3 = 0.5 * x4q2q3 / x2q2;
            }
            else if (x4q3_2 >= x4q0_2 && x4q3_2 >= x4q1_2 && x4q3_2 >= x4q2_2) // 4q3_2 Largest
            {
                const double x2q3 = sqrt(x4q3_2);
                q0 = 0.5 * x4q0q3 / x2q3;
                q1 = 0.5 * x4q1q3 / x2q3;
                q2 = 0.5 * x4q2q3 / x2q3;
                q3 = 0.5 * x2q3;
            }
            return Quaternion(q0, q1, q2, q3);
        }
        return Quaternion::identity();
    }